

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

RC __thiscall PF_BufferMgr::InternalAlloc(PF_BufferMgr *this,int *slot)

{
  int iVar1;
  int iVar2;
  RC RVar3;
  PF_BufPageDesc *pPVar4;
  long lVar5;
  bool bVar6;
  
  iVar1 = this->free;
  if ((long)iVar1 == -1) {
    lVar5 = (long)this->last;
    *slot = this->last;
    RVar3 = -2;
    bVar6 = lVar5 == -1;
    if (!bVar6) {
      pPVar4 = this->bufTable;
      do {
        if (pPVar4[lVar5].pinCount == 0) {
          if (bVar6) {
            return -2;
          }
          if (this->bufTable[(int)lVar5].bDirty != 0) {
            pPVar4 = this->bufTable + (int)lVar5;
            RVar3 = WritePage(this,pPVar4->fd,pPVar4->pageNum,pPVar4->pData);
            if (RVar3 != 0) {
              return RVar3;
            }
            this->bufTable[*slot].bDirty = 0;
          }
          RVar3 = PF_HashTable::Delete
                            (&this->hashTable,this->bufTable[*slot].fd,this->bufTable[*slot].pageNum
                            );
          if (RVar3 != 0) {
            return RVar3;
          }
          Unlink(this,*slot);
          goto LAB_00102b6b;
        }
        iVar1 = pPVar4[lVar5].prev;
        lVar5 = (long)iVar1;
        *slot = iVar1;
        bVar6 = lVar5 == -1;
      } while (!bVar6);
    }
  }
  else {
    *slot = iVar1;
    this->free = this->bufTable[iVar1].next;
LAB_00102b6b:
    iVar1 = *slot;
    iVar2 = this->first;
    pPVar4 = this->bufTable;
    pPVar4[iVar1].next = iVar2;
    pPVar4[iVar1].prev = -1;
    if ((long)iVar2 != -1) {
      pPVar4[iVar2].prev = iVar1;
    }
    this->first = iVar1;
    RVar3 = 0;
    if (this->last == -1) {
      this->last = iVar1;
      RVar3 = 0;
    }
  }
  return RVar3;
}

Assistant:

RC PF_BufferMgr::InternalAlloc(int &slot)
{
   RC  rc;       // return code

   // If the free list is not empty, choose a slot from the free list
   if (free != INVALID_SLOT) {
      slot = free;
      free = bufTable[slot].next;
   }
   else {

      // Choose the least-recently used page that is unpinned
      for (slot = last; slot != INVALID_SLOT; slot = bufTable[slot].prev) {
         if (bufTable[slot].pinCount == 0)
            break;
      }

      // Return error if all buffers were pinned
      if (slot == INVALID_SLOT)
         return (PF_NOBUF);

      // Write out the page if it is dirty
      if (bufTable[slot].bDirty) {
         if ((rc = WritePage(bufTable[slot].fd, bufTable[slot].pageNum,
               bufTable[slot].pData)))
            return (rc);

         bufTable[slot].bDirty = FALSE;
      }

      // Remove page from the hash table and slot from the used buffer list
      if ((rc = hashTable.Delete(bufTable[slot].fd, bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)))
         return (rc);
   }

   // Link slot at the head of the used list
   if ((rc = LinkHead(slot)))
      return (rc);

   // Return ok
   return (0);
}